

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Leases.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Leases::tidy
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Leases *this,Parameters *parameters)

{
  Client *client;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Url local_40;
  Parameters *local_20;
  Parameters *parameters_local;
  Leases *this_local;
  
  client = *(Client **)this;
  local_20 = parameters;
  parameters_local = (Parameters *)this;
  this_local = (Leases *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"tidy",&local_81);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60,&local_80);
  getUrl(&local_40,this,&local_60);
  HttpConsumer::post(__return_storage_ptr__,client,&local_40,local_20);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Leases::tidy(const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Path{"tidy"}), parameters);
}